

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
vkt::shaderexecutor::VariableStatement<tcu::Vector<float,_3>_>::doExecute
          (VariableStatement<tcu::Vector<float,_3>_> *this,EvalContext *ctx)

{
  Environment *this_00;
  Variable<tcu::Vector<float,_3>_> *variable;
  Expr<tcu::Vector<float,_3>_> *pEVar1;
  IVal *pIVar2;
  long lVar3;
  IVal *pIVar4;
  byte bVar5;
  IVal IStack_68;
  
  bVar5 = 0;
  if (this->m_isDeclaration == true) {
    this_00 = ctx->env;
    variable = (this->m_variable).
               super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_ptr;
    pEVar1 = (this->m_value).super_ContainerExprPBase<tcu::Vector<float,_3>_>.
             super_ExprPBase<tcu::Vector<float,_3>_>.
             super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_3>_>_>.m_ptr;
    (*(pEVar1->super_ExprBase)._vptr_ExprBase[4])(&IStack_68,pEVar1,ctx);
    Environment::bind<tcu::Vector<float,3>>(this_00,variable,&IStack_68);
  }
  else {
    pEVar1 = (this->m_value).super_ContainerExprPBase<tcu::Vector<float,_3>_>.
             super_ExprPBase<tcu::Vector<float,_3>_>.
             super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_3>_>_>.m_ptr;
    (*(pEVar1->super_ExprBase)._vptr_ExprBase[4])(&IStack_68,pEVar1,ctx);
    pIVar2 = Environment::lookup<tcu::Vector<float,3>>
                       (ctx->env,(this->m_variable).
                                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>
                                 .m_ptr);
    pIVar4 = &IStack_68;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined8 *)pIVar2->m_data = *(undefined8 *)pIVar4;
      pIVar4 = (IVal *)((long)pIVar4 + ((ulong)bVar5 * -2 + 1) * 8);
      pIVar2 = (IVal *)((long)pIVar2 + ((ulong)bVar5 * -2 + 1) * 8);
    }
  }
  return;
}

Assistant:

void			doExecute			(EvalContext& ctx)						const
	{
		if (m_isDeclaration)
			ctx.env.bind(*m_variable, m_value->evaluate(ctx));
		else
			ctx.env.lookup(*m_variable) = m_value->evaluate(ctx);
	}